

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::IndexPropertyDescriptorMap::IndexPropertyDescriptorMap
          (IndexPropertyDescriptorMap *this,Recycler *recycler,
          IndexPropertyDescriptorMap *indexPropertyDescriptorMap)

{
  uint32 *puVar1;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  
  this->recycler = recycler;
  (this->indexPropertyMap).ptr =
       (BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->indexList).ptr = (uint *)0x0;
  this->lastIndexAt = indexPropertyDescriptorMap->lastIndexAt;
  puVar1 = CopyIndexList(indexPropertyDescriptorMap);
  Memory::Recycler::WBSetBit((char *)&this->indexList);
  (this->indexList).ptr = puVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->indexList);
  pBVar2 = JsUtil::
           BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Clone((indexPropertyDescriptorMap->indexPropertyMap).ptr);
  Memory::Recycler::WBSetBit((char *)&this->indexPropertyMap);
  (this->indexPropertyMap).ptr = pBVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->indexPropertyMap);
  return;
}

Assistant:

IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(Recycler* recycler, const IndexPropertyDescriptorMap * const indexPropertyDescriptorMap)
        : recycler(recycler), lastIndexAt(indexPropertyDescriptorMap->lastIndexAt)
    {
        indexList = indexPropertyDescriptorMap->CopyIndexList();
        indexPropertyMap = indexPropertyDescriptorMap->indexPropertyMap->Clone();
    }